

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  float fVar1;
  bool bVar2;
  undefined1 uVar3;
  float *pfVar4;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *bboxes;
  vector<int,_std::allocator<int>_> *picked_00;
  size_type sVar5;
  Mat *this_00;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar9;
  float *outptr_1;
  int i_4;
  Mat *roi_score_blob;
  float *outptr;
  int i_3;
  Mat *roi_blob;
  int picked_count;
  vector<int,_std::allocator<int>_> picked;
  Rect r;
  float pb_h_1;
  float pb_w_1;
  float *pb_2;
  int i_2;
  float *scoreptr;
  Mat pbs_2;
  int q_2;
  float min_boxsize;
  float im_scale;
  vector<float,_std::allocator<float>_> scores;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  float *pb_1;
  int i_1;
  Mat pbs_1;
  int q_1;
  float im_h;
  float im_w;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float cy;
  float cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float *pb;
  int j;
  float anchor_x;
  int i;
  float anchor_h;
  float anchor_w;
  float anchor_y;
  float *anchor;
  Mat pbs;
  float *bbox_hptr;
  float *bbox_wptr;
  float *bbox_yptr;
  float *bbox_xptr;
  int q;
  Mat proposals;
  int num_anchors;
  int h;
  int w;
  Mat *im_info_blob;
  Mat *bbox_blob;
  Mat *score_blob;
  Mat *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb4c;
  int iVar10;
  Mat *in_stack_fffffffffffffb50;
  float *in_stack_fffffffffffffbc0;
  float fVar11;
  Mat local_3d8;
  Mat *local_3a8;
  int local_39c;
  reference local_398;
  Mat local_390;
  vector<float,_std::allocator<float>_> *local_360;
  int local_358;
  undefined4 local_354;
  reference local_350;
  int local_348;
  int local_344;
  vector<int,_std::allocator<int>_> local_340;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float *local_310;
  int local_304;
  Mat local_300;
  float *local_2d0;
  Mat local_2c8;
  int local_294;
  float local_290;
  float local_28c;
  vector<float,_std::allocator<float>_> local_288;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_270;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float *local_238;
  int local_22c;
  Mat local_228;
  int local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float *local_1c0;
  int local_1b8;
  float local_1b4;
  int local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float *local_1a0;
  Mat local_198;
  Mat local_168;
  float *local_138;
  Mat local_130;
  float *local_100;
  Mat local_f8;
  float *local_c8;
  Mat local_c0;
  float *local_90;
  int local_88;
  Mat local_78;
  int local_44;
  int local_40;
  int local_3c;
  const_reference local_38;
  const_reference local_30;
  const_reference local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_3c = local_28->w;
  local_40 = local_28->h;
  local_44 = *(int *)(in_RDI + 0x118);
  Mat::Mat(&local_78);
  Mat::create(in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
              (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
              CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  for (local_88 = 0; local_88 < local_44; local_88 = local_88 + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_c0);
    Mat::~Mat((Mat *)0x11eea3);
    local_90 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_f8);
    Mat::~Mat((Mat *)0x11eefe);
    local_c8 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_130);
    Mat::~Mat((Mat *)0x11ef59);
    local_100 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_168);
    Mat::~Mat((Mat *)0x11efb4);
    local_138 = pfVar4;
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    local_1a0 = Mat::row((Mat *)(in_RDI + 0xf8),local_88);
    local_1a4 = local_1a0[1];
    local_1a8 = local_1a0[2] - *local_1a0;
    local_1ac = local_1a0[3] - local_1a0[1];
    for (local_1b0 = 0; local_1b0 < local_40; local_1b0 = local_1b0 + 1) {
      local_1b4 = *local_1a0;
      for (local_1b8 = 0; local_1b8 < local_3c; local_1b8 = local_1b8 + 1) {
        local_1c0 = Mat::row(&local_198,local_1b0 * local_3c + local_1b8);
        fVar1 = local_1a8;
        local_1c4 = local_90[local_1b8];
        local_1c8 = local_c8[local_1b8];
        local_1cc = local_100[local_1b8];
        local_1d0 = local_138[local_1b8];
        local_1d4 = local_1b4 + local_1a8 * 0.5;
        local_1d8 = local_1a4 + local_1ac * 0.5;
        local_1dc = local_1d4 + local_1a8 * local_1c4;
        local_1e0 = local_1d8 + local_1ac * local_1c8;
        dVar9 = std::exp((double)(ulong)(uint)local_1cc);
        fVar11 = local_1ac;
        local_1e4 = fVar1 * SUB84(dVar9,0);
        dVar9 = std::exp((double)(ulong)(uint)local_1d0);
        local_1e8 = fVar11 * SUB84(dVar9,0);
        *local_1c0 = local_1dc - local_1e4 * 0.5;
        local_1c0[1] = local_1e0 - local_1e8 * 0.5;
        local_1c0[2] = local_1dc + local_1e4 * 0.5;
        local_1c0[3] = local_1e0 + local_1e8 * 0.5;
        local_1b4 = (float)*(int *)(in_RDI + 0x80) + local_1b4;
      }
      local_90 = local_90 + local_3c;
      local_c8 = local_c8 + local_3c;
      local_100 = local_100 + local_3c;
      local_138 = local_138 + local_3c;
      local_1a4 = (float)*(int *)(in_RDI + 0x80) + local_1a4;
    }
    Mat::~Mat((Mat *)0x11f53b);
  }
  bboxes = (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)Mat::operator[](local_38,1);
  local_1ec = *(float *)&(bboxes->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>).
                         _M_impl.super__Vector_impl_data._M_start;
  picked_00 = (vector<int,_std::allocator<int>_> *)Mat::operator[](local_38,0);
  local_1f0 = *(float *)&(picked_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
  for (local_1f4 = 0; local_1f4 < local_44; local_1f4 = local_1f4 + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    for (local_22c = 0; local_22c < local_3c * local_40; local_22c = local_22c + 1) {
      in_stack_fffffffffffffbc0 = Mat::row(&local_228,local_22c);
      local_23c = local_1ec + -1.0;
      local_238 = in_stack_fffffffffffffbc0;
      pfVar4 = std::min<float>(in_stack_fffffffffffffbc0,&local_23c);
      local_240 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_240);
      *local_238 = *pfVar4;
      local_244 = local_1f0 + -1.0;
      pfVar4 = std::min<float>(local_238 + 1,&local_244);
      local_248 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_248);
      local_238[1] = *pfVar4;
      local_24c = local_1ec + -1.0;
      pfVar4 = std::min<float>(local_238 + 2,&local_24c);
      local_250 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_250);
      local_238[2] = *pfVar4;
      local_254 = local_1f0 + -1.0;
      pfVar4 = std::min<float>(local_238 + 3,&local_254);
      local_258 = 0.0;
      pfVar4 = std::max<float>(pfVar4,&local_258);
      local_238[3] = *pfVar4;
    }
    Mat::~Mat((Mat *)0x11f87a);
  }
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)0x11f89d);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x11f8aa);
  pfVar4 = Mat::operator[](local_38,2);
  local_28c = *pfVar4;
  local_290 = (float)*(int *)(in_RDI + 0x94) * local_28c;
  for (local_294 = 0; fVar11 = (float)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
      local_294 < local_44; local_294 = local_294 + 1) {
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    pfVar4 = Mat::operator_cast_to_float_(&local_300);
    Mat::~Mat((Mat *)0x11f97c);
    local_2d0 = pfVar4;
    for (local_304 = 0; local_304 < local_3c * local_40; local_304 = local_304 + 1) {
      local_310 = Mat::row(&local_2c8,local_304);
      local_314 = (local_310[2] - *local_310) + 1.0;
      local_318 = (local_310[3] - local_310[1]) + 1.0;
      if ((local_290 <= local_314) && (local_290 <= local_318)) {
        local_328 = *local_310;
        local_324 = local_310[1];
        local_320 = local_310[2];
        local_31c = local_310[3];
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffb40,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_fffffffffffffb40,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
      }
    }
    Mat::~Mat((Mat *)0x11fb6f);
  }
  qsort_descent_inplace<ncnn::Rect>
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffb40,
             (vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  if ((0 < *(int *)(in_RDI + 0x88)) &&
     (iVar10 = *(int *)(in_RDI + 0x88),
     sVar5 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size(&local_270),
     iVar10 < (int)sVar5)) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffb50,
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb50,
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11fc39);
  nms_sorted_bboxes(bboxes,picked_00,fVar11);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_340);
  local_348 = (int)sVar5;
  this_00 = (Mat *)std::min<int>(&local_348,(int *)(in_RDI + 0x8c));
  local_344 = *(int *)&this_00->data;
  local_350 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(this_00,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48,
              (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
              CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  bVar2 = Mat::empty(in_stack_fffffffffffffb30);
  iVar10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb4c);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    for (local_358 = 0; local_358 < local_344; local_358 = local_358 + 1) {
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                   (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      in_stack_fffffffffffffb40 =
           (vector<float,_std::allocator<float>_> *)Mat::operator_cast_to_float_(&local_390);
      Mat::~Mat((Mat *)0x11fd90);
      local_360 = in_stack_fffffffffffffb40;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,(long)local_358);
      pvVar7 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_270,(long)*pvVar6);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_360->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_start = pvVar7->x1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,(long)local_358);
      pvVar7 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_270,(long)*pvVar6);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_360->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_start + 4) = pvVar7->y1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,(long)local_358);
      pvVar7 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_270,(long)*pvVar6);
      *(float *)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                  &local_360->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                 super__Vector_impl_data._M_finish = pvVar7->x2;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,(long)local_358);
      pvVar7 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_270,(long)*pvVar6);
      *(float *)((long)&(((_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                         &local_360->super__Vector_base<float,_std::allocator<float>_>)->_M_impl).
                        super__Vector_impl_data._M_finish + 4) = pvVar7->y2;
    }
    sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (1 < sVar5) {
      local_398 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      Mat::create(this_00,iVar10,in_stack_fffffffffffffb48,
                  (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
                  CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
      uVar3 = Mat::empty(in_stack_fffffffffffffb30);
      if ((bool)uVar3) {
        local_4 = -100;
        goto LAB_00120030;
      }
      for (local_39c = 0; local_39c < local_344; local_39c = local_39c + 1) {
        Mat::channel((Mat *)CONCAT17(uVar3,in_stack_fffffffffffffb38),
                     (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        in_stack_fffffffffffffb30 = (Mat *)Mat::operator_cast_to_float_(&local_3d8);
        Mat::~Mat((Mat *)0x11ff9d);
        local_3a8 = in_stack_fffffffffffffb30;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,(long)local_39c);
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_288,(long)*pvVar6);
        *(value_type *)&local_3a8->data = *pvVar8;
      }
    }
    local_4 = 0;
  }
LAB_00120030:
  local_354 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb40);
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffb40);
  Mat::~Mat((Mat *)0x120064);
  return local_4;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}